

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableFilter.cpp
# Opt level: O0

void __thiscall
Ptex::v2_4::PtexSeparableFilter::apply
          (PtexSeparableFilter *this,PtexSeparableKernel *k,int faceid,FaceInfo *f)

{
  _func_int *p_Var1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  PtexFaceData *pPVar8;
  float *__s;
  undefined4 extraout_var_00;
  float *pfVar9;
  int iVar10;
  undefined8 uStackY_230;
  undefined8 in_stack_fffffffffffffdd8;
  void *in_stack_fffffffffffffde0;
  float *in_stack_fffffffffffffde8;
  PtexSeparableKernel *in_stack_fffffffffffffdf0;
  int local_114;
  int i;
  PtexPtr<Ptex::v2_4::PtexFaceData> th;
  int local_100;
  int tileu;
  int uw;
  int u;
  int tilev;
  int vw;
  int v;
  int ntilesu;
  int tileresv;
  int tileresu;
  PtexSeparableKernel kt;
  Res tileres;
  float *result;
  bool tanvecMode;
  PtexPtr<Ptex::v2_4::PtexFaceData> local_30;
  PtexPtr<Ptex::v2_4::PtexFaceData> dh;
  FaceInfo *f_local;
  int faceid_local;
  PtexSeparableKernel *k_local;
  PtexSeparableFilter *this_local;
  
  pfVar9 = (float *)&stack0xfffffffffffffdd8;
  if ((0 < k->uw) && (dh._ptr = (PtexFaceData *)f, 0 < k->vw)) {
    while( true ) {
      iVar4 = Res::u(&k->res);
      iVar5 = Res::u((Res *)dh._ptr);
      if (iVar4 <= iVar5) break;
      PtexSeparableKernel::downresU(k);
    }
    while( true ) {
      iVar4 = Res::v(&k->res);
      iVar5 = Res::v((Res *)dh._ptr);
      if (iVar4 <= iVar5) break;
      PtexSeparableKernel::downresV(k);
    }
    iVar4 = (*this->_tx->_vptr_PtexTexture[0x14])
                      (this->_tx,(ulong)(uint)faceid,(ulong)(ushort)k->res);
    PtexPtr<Ptex::v2_4::PtexFaceData>::PtexPtr
              (&local_30,(PtexFaceData *)CONCAT44(extraout_var,iVar4));
    pPVar8 = PtexPtr::operator_cast_to_PtexFaceData_((PtexPtr *)&local_30);
    if (pPVar8 != (PtexFaceData *)0x0) {
      pPVar8 = PtexPtr<Ptex::v2_4::PtexFaceData>::operator->(&local_30);
      uVar6 = (*pPVar8->_vptr_PtexFaceData[3])();
      if ((uVar6 & 1) == 0) {
        bVar2 = false;
        if ((this->_efm == efm_tanvec) && (bVar2 = false, 1 < this->_nchan)) {
          bVar2 = 0 < k->rot;
        }
        if (bVar2) {
          lVar3 = -((long)this->_nchan * 4 + 0xfU & 0xfffffffffffffff0);
          __s = (float *)(&stack0xfffffffffffffdd8 + lVar3);
          iVar4 = this->_nchan;
          *(undefined8 *)((long)&uStackY_230 + lVar3) = 0xa0077b;
          memset(__s,0,(long)iVar4 << 2);
          pfVar9 = __s;
        }
        else {
          __s = this->_result;
          pfVar9 = (float *)&stack0xfffffffffffffdd8;
        }
        pfVar9[-2] = 1.4696375e-38;
        pfVar9[-1] = 0.0;
        pPVar8 = PtexPtr<Ptex::v2_4::PtexFaceData>::operator->(&local_30);
        p_Var1 = pPVar8->_vptr_PtexFaceData[7];
        pfVar9[-2] = 1.469641e-38;
        pfVar9[-1] = 0.0;
        uVar6 = (*p_Var1)();
        if ((uVar6 & 1) == 0) {
          pfVar9[-2] = 1.469796e-38;
          pfVar9[-1] = 0.0;
          pPVar8 = PtexPtr<Ptex::v2_4::PtexFaceData>::operator->(&local_30);
          p_Var1 = pPVar8->_vptr_PtexFaceData[6];
          pfVar9[-2] = 1.4697995e-38;
          pfVar9[-1] = 0.0;
          (*p_Var1)();
          pfVar9[-2] = 1.469808e-38;
          pfVar9[-1] = 0.0;
          PtexSeparableKernel::apply
                    (*(PtexSeparableKernel **)(pfVar9 + 10),*(float **)(pfVar9 + 8),
                     *(void **)(pfVar9 + 6),(DataType)pfVar9[5],(int)pfVar9[4],(int)pfVar9[3]);
        }
        else {
          pfVar9[-2] = 1.4696455e-38;
          pfVar9[-1] = 0.0;
          pPVar8 = PtexPtr<Ptex::v2_4::PtexFaceData>::operator->(&local_30);
          p_Var1 = pPVar8->_vptr_PtexFaceData[8];
          pfVar9[-2] = 1.469649e-38;
          pfVar9[-1] = 0.0;
          iVar4 = (*p_Var1)();
          kt._126_2_ = (short)iVar4;
          pfVar9[-2] = 1.4696535e-38;
          pfVar9[-1] = 0.0;
          PtexSeparableKernel::PtexSeparableKernel(*(PtexSeparableKernel **)(pfVar9 + 2));
          pfVar9[-2] = 1.4696566e-38;
          pfVar9[-1] = 0.0;
          iVar4 = Res::u((Res *)&kt.field_0x7e);
          pfVar9[-2] = 1.4696607e-38;
          pfVar9[-1] = 0.0;
          iVar5 = Res::v((Res *)&kt.field_0x7e);
          pfVar9[-2] = 1.4696647e-38;
          pfVar9[-1] = 0.0;
          iVar7 = Res::u(&k->res);
          tilev = k->v;
          for (u = k->vw; 0 < u; u = u - kt.v) {
            kt._0_4_ = tilev % iVar5;
            iVar10 = iVar5 - kt._0_4_;
            pfVar9[-2] = 1.4696834e-38;
            pfVar9[-1] = 0.0;
            kt.v = PtexUtils::min<int>(u,iVar10);
            kt.ku = k->kv + ((long)tilev - (long)k->v);
            tileu = k->u;
            for (local_100 = k->uw; 0 < local_100; local_100 = local_100 - kt.u) {
              th._ptr._4_4_ = tileu / iVar4;
              pfVar9[-2] = 1.4697079e-38;
              pfVar9[-1] = 0.0;
              kt.u = PtexUtils::min<int>(local_100,iVar4 - tileu % iVar4);
              kt._16_8_ = k->ku + ((long)tileu - (long)k->u);
              pfVar9[-2] = 1.4697171e-38;
              pfVar9[-1] = 0.0;
              pPVar8 = PtexPtr<Ptex::v2_4::PtexFaceData>::operator->(&local_30);
              uVar6 = (tilev / iVar5) * (iVar7 / iVar4) + th._ptr._4_4_;
              p_Var1 = pPVar8->_vptr_PtexFaceData[9];
              pfVar9[-2] = 1.4697239e-38;
              pfVar9[-1] = 0.0;
              iVar10 = (*p_Var1)(pPVar8,(ulong)uVar6);
              pfVar9[-2] = 1.4697278e-38;
              pfVar9[-1] = 0.0;
              PtexPtr<Ptex::v2_4::PtexFaceData>::PtexPtr
                        ((PtexPtr<Ptex::v2_4::PtexFaceData> *)&stack0xfffffffffffffef0,
                         (PtexFaceData *)CONCAT44(extraout_var_00,iVar10));
              pfVar9[-2] = 1.4697298e-38;
              pfVar9[-1] = 0.0;
              pPVar8 = PtexPtr::operator_cast_to_PtexFaceData_((PtexPtr *)&stack0xfffffffffffffef0);
              if (pPVar8 != (PtexFaceData *)0x0) {
                pfVar9[-2] = 1.4697351e-38;
                pfVar9[-1] = 0.0;
                pPVar8 = PtexPtr<Ptex::v2_4::PtexFaceData>::operator->
                                   ((PtexPtr<Ptex::v2_4::PtexFaceData> *)&stack0xfffffffffffffef0);
                p_Var1 = pPVar8->_vptr_PtexFaceData[3];
                pfVar9[-2] = 1.4697386e-38;
                pfVar9[-1] = 0.0;
                uVar6 = (*p_Var1)();
                if ((uVar6 & 1) == 0) {
                  pfVar9[-2] = 1.4697646e-38;
                  pfVar9[-1] = 0.0;
                  pPVar8 = PtexPtr<Ptex::v2_4::PtexFaceData>::operator->
                                     ((PtexPtr<Ptex::v2_4::PtexFaceData> *)&stack0xfffffffffffffef0)
                  ;
                  p_Var1 = pPVar8->_vptr_PtexFaceData[6];
                  pfVar9[-2] = 1.4697681e-38;
                  pfVar9[-1] = 0.0;
                  (*p_Var1)();
                  pfVar9[-2] = 1.4697766e-38;
                  pfVar9[-1] = 0.0;
                  PtexSeparableKernel::apply
                            (*(PtexSeparableKernel **)(pfVar9 + 10),*(float **)(pfVar9 + 8),
                             *(void **)(pfVar9 + 6),(DataType)pfVar9[5],(int)pfVar9[4],
                             (int)pfVar9[3]);
                }
                else {
                  pfVar9[-2] = 1.469745e-38;
                  pfVar9[-1] = 0.0;
                  pPVar8 = PtexPtr<Ptex::v2_4::PtexFaceData>::operator->
                                     ((PtexPtr<Ptex::v2_4::PtexFaceData> *)&stack0xfffffffffffffef0)
                  ;
                  p_Var1 = pPVar8->_vptr_PtexFaceData[6];
                  pfVar9[-2] = 1.4697485e-38;
                  pfVar9[-1] = 0.0;
                  (*p_Var1)();
                  pfVar9[-2] = 1.4697564e-38;
                  pfVar9[-1] = 0.0;
                  PtexSeparableKernel::applyConst
                            (*(PtexSeparableKernel **)(pfVar9 + 6),*(float **)(pfVar9 + 4),
                             *(void **)(pfVar9 + 2),(DataType)pfVar9[1],(int)*pfVar9);
                }
              }
              pfVar9[-2] = 1.4697791e-38;
              pfVar9[-1] = 0.0;
              PtexPtr<Ptex::v2_4::PtexFaceData>::~PtexPtr
                        (*(PtexPtr<Ptex::v2_4::PtexFaceData> **)(pfVar9 + 2));
              tileu = kt.u + tileu;
            }
            tilev = kt.v + tilev;
          }
        }
        if (bVar2) {
          switch(k->rot) {
          case 0:
            *this->_result = *__s + *this->_result;
            this->_result[1] = __s[1] + this->_result[1];
            break;
          case 1:
            *this->_result = *this->_result - __s[1];
            this->_result[1] = *__s + this->_result[1];
            break;
          case 2:
            *this->_result = *this->_result - *__s;
            this->_result[1] = this->_result[1] - __s[1];
            break;
          case 3:
            *this->_result = __s[1] + *this->_result;
            this->_result[1] = this->_result[1] - *__s;
          }
          for (local_114 = 2; local_114 < this->_nchan; local_114 = local_114 + 1) {
            this->_result[local_114] = __s[local_114] + this->_result[local_114];
          }
        }
      }
      else {
        pPVar8 = PtexPtr<Ptex::v2_4::PtexFaceData>::operator->(&local_30);
        (*pPVar8->_vptr_PtexFaceData[6])();
        PtexSeparableKernel::applyConst
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                   (DataType)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                   (int)(float)in_stack_fffffffffffffdd8);
        pfVar9 = (float *)&stack0xfffffffffffffdd8;
      }
    }
    pfVar9[-2] = 1.469863e-38;
    pfVar9[-1] = 0.0;
    PtexPtr<Ptex::v2_4::PtexFaceData>::~PtexPtr(*(PtexPtr<Ptex::v2_4::PtexFaceData> **)(pfVar9 + 2))
    ;
  }
  return;
}

Assistant:

void PtexSeparableFilter::apply(PtexSeparableKernel& k, int faceid, const Ptex::FaceInfo& f)
{
    assert(k.u >= 0 && k.u + k.uw <= k.res.u());
    assert(k.v >= 0 && k.v + k.vw <= k.res.v());

    if (k.uw <= 0 || k.vw <= 0) return;

    // downres kernel if needed
    while (k.res.u() > f.res.u()) k.downresU();
    while (k.res.v() > f.res.v()) k.downresV();

    // get face data, and apply
    PtexPtr<PtexFaceData> dh ( _tx->getData(faceid, k.res) );
    if (!dh) return;

    if (dh->isConstant()) {
        k.applyConst(_result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan);
        return;
    }

    // allocate temporary result for tanvec mode (if needed)
    bool tanvecMode = (_efm == efm_tanvec) && (_nchan >= 2) && (k.rot > 0);
    float* result = tanvecMode ? (float*) alloca(sizeof(float)*_nchan) : _result;
    if (tanvecMode) memset(result, 0, sizeof(float)*_nchan);

    if (dh->isTiled()) {
        Ptex::Res tileres = dh->tileRes();
        PtexSeparableKernel kt;
        kt.res = tileres;
        int tileresu = tileres.u();
        int tileresv = tileres.v();
        int ntilesu = k.res.u() / tileresu;
        for (int v = k.v, vw = k.vw; vw > 0; vw -= kt.vw, v += kt.vw) {
            int tilev = v / tileresv;
            kt.v = v % tileresv;
            kt.vw = PtexUtils::min(vw, tileresv - kt.v);
            kt.kv = k.kv + v - k.v;
            for (int u = k.u, uw = k.uw; uw > 0; uw -= kt.uw, u += kt.uw) {
                int tileu = u / tileresu;
                kt.u = u % tileresu;
                kt.uw = PtexUtils::min(uw, tileresu - kt.u);
                kt.ku = k.ku + u - k.u;
                PtexPtr<PtexFaceData> th ( dh->getTile(tilev * ntilesu + tileu) );
                if (th) {
                    if (th->isConstant())
                        kt.applyConst(result, (char*)th->getData()+_firstChanOffset, _dt, _nchan);
                    else
                        kt.apply(result, (char*)th->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
                }
            }
        }
    }
    else {
        k.apply(result, (char*)dh->getData()+_firstChanOffset, _dt, _nchan, _ntxchan);
    }

    if (tanvecMode) {
        // rotate tangent-space vector data and update main result
        switch (k.rot) {
            case 0: // rot==0 included for completeness, but tanvecMode should be false in this case
                _result[0] += result[0];
                _result[1] += result[1];
                break;
            case 1:
                _result[0] -= result[1];
                _result[1] += result[0];
                break;
            case 2:
                _result[0] -= result[0];
                _result[1] -= result[1];
                break;
            case 3:
                _result[0] += result[1];
                _result[1] -= result[0];
                break;
        }
        for (int i = 2; i < _nchan; i++) _result[i] += result[i];
    }
}